

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O3

void qtree_bitins64(uchar *a,int nx,int ny,LONGLONG *b,int n,int bit)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uchar *puVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  byte *pbVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  
  uVar14 = 1L << ((byte)bit & 0x3f);
  iVar9 = 0;
  iVar1 = 0;
  if (1 < nx) {
    auVar18._8_4_ = (int)uVar14;
    auVar18._0_8_ = uVar14;
    auVar18._12_4_ = (int)(uVar14 >> 0x20);
    iVar6 = 0;
    iVar1 = 0;
    iVar9 = 0;
    do {
      if (ny < 2) {
        iVar5 = iVar1 * n;
        iVar8 = 0;
      }
      else {
        lVar3 = (long)iVar6;
        lVar2 = (long)n;
        puVar10 = a + iVar9;
        lVar17 = 8;
        lVar7 = 0;
        lVar4 = lVar3;
        do {
          switch(*puVar10) {
          case '\x01':
            puVar12 = (ulong *)((long)b + lVar17 + lVar3 * 8 + lVar2 * 8);
            goto LAB_001c8db0;
          case '\x02':
            puVar12 = (ulong *)(b + n + lVar4);
            goto LAB_001c8db0;
          case '\x03':
            puVar12 = (ulong *)(b + n + lVar4);
            b[lVar2 + lVar3 + lVar7 + 1] = b[lVar2 + lVar3 + lVar7 + 1] | uVar14;
            goto LAB_001c8db0;
          case '\x04':
            goto switchD_001c8d43_caseD_4;
          case '\x05':
            b[lVar2 + lVar3 + lVar7 + 1] = b[lVar2 + lVar3 + lVar7 + 1] | uVar14;
            goto switchD_001c8d43_caseD_4;
          case '\x06':
            b[lVar2 + lVar3 + lVar7] = b[lVar2 + lVar3 + lVar7] | uVar14;
            goto switchD_001c8d43_caseD_4;
          case '\a':
            *(undefined1 (*) [16])(b + lVar2 + lVar3 + lVar7) =
                 *(undefined1 (*) [16])(b + lVar2 + lVar3 + lVar7) | auVar18;
switchD_001c8d43_caseD_4:
            puVar12 = (ulong *)(b + lVar4 + 1);
            goto LAB_001c8db0;
          case '\b':
            break;
          case '\t':
            b[lVar2 + lVar3 + lVar7 + 1] = b[lVar2 + lVar3 + lVar7 + 1] | uVar14;
            break;
          case '\n':
            b[lVar2 + lVar3 + lVar7] = b[lVar2 + lVar3 + lVar7] | uVar14;
            break;
          case '\v':
            *(undefined1 (*) [16])(b + lVar2 + lVar3 + lVar7) =
                 *(undefined1 (*) [16])(b + lVar2 + lVar3 + lVar7) | auVar18;
            break;
          case '\f':
            goto switchD_001c8d43_caseD_c;
          case '\r':
            b[lVar2 + lVar3 + lVar7 + 1] = b[lVar2 + lVar3 + lVar7 + 1] | uVar14;
            goto switchD_001c8d43_caseD_c;
          case '\x0e':
            b[lVar2 + lVar3 + lVar7] = b[lVar2 + lVar3 + lVar7] | uVar14;
            goto switchD_001c8d43_caseD_c;
          case '\x0f':
            *(undefined1 (*) [16])(b + lVar2 + lVar3 + lVar7) =
                 *(undefined1 (*) [16])(b + lVar2 + lVar3 + lVar7) | auVar18;
switchD_001c8d43_caseD_c:
            b[lVar3 + lVar7 + 1] = b[lVar3 + lVar7 + 1] | uVar14;
            break;
          default:
            goto switchD_001c8d43_default;
          }
          puVar12 = (ulong *)(b + lVar4);
LAB_001c8db0:
          *puVar12 = *puVar12 | uVar14;
switchD_001c8d43_default:
          lVar4 = lVar4 + 2;
          puVar10 = puVar10 + 1;
          lVar7 = lVar7 + 2;
          lVar17 = lVar17 + 0x10;
        } while ((int)lVar7 < ny + -1);
        iVar9 = iVar9 + (ny - 2U >> 1) + 1;
        iVar5 = (int)lVar7 + iVar6;
        iVar8 = (ny - 2U & 0xfffffffe) + 2;
      }
      if (iVar8 < ny) {
        switch(a[iVar9]) {
        case '\x02':
        case '\x03':
        case '\x06':
        case '\a':
          iVar5 = iVar5 + n;
          break;
        default:
          goto switchD_001c8e36_caseD_4;
        case '\b':
        case '\t':
        case '\f':
        case '\r':
          break;
        case '\n':
        case '\v':
        case '\x0e':
        case '\x0f':
          b[n + iVar5] = b[n + iVar5] | uVar14;
        }
        b[iVar5] = b[iVar5] | uVar14;
switchD_001c8e36_caseD_4:
        iVar9 = iVar9 + 1;
      }
      iVar1 = iVar1 + 2;
      iVar6 = iVar6 + n * 2;
    } while (iVar1 < nx + -1);
  }
  if (iVar1 < nx) {
    iVar1 = iVar1 * n;
    iVar6 = 0;
    if (1 < ny) {
      uVar11 = (ulong)iVar1;
      pbVar15 = a + iVar9;
      lVar4 = 0;
      uVar16 = uVar11;
      do {
        if (*pbVar15 - 4 < 0xc) {
          uVar13 = uVar11 + lVar4;
          switch((uint)*pbVar15) {
          default:
            uVar13 = uVar16 | 1;
            break;
          case 8:
          case 9:
          case 10:
          case 0xb:
            break;
          case 0xc:
          case 0xd:
          case 0xe:
          case 0xf:
            b[uVar11 + lVar4 + 1] = b[uVar11 + lVar4 + 1] | uVar14;
          }
          b[uVar13] = b[uVar13] | uVar14;
        }
        uVar16 = uVar16 + 2;
        pbVar15 = pbVar15 + 1;
        lVar4 = lVar4 + 2;
      } while ((int)lVar4 < ny + -1);
      iVar9 = iVar9 + (ny - 2U >> 1) + 1;
      iVar6 = (ny - 2U & 0xfffffffe) + 2;
      iVar1 = iVar1 + (int)lVar4;
    }
    if ((iVar6 < ny) && ((a[iVar9] & 0xf8) == 8)) {
      b[iVar1] = b[iVar1] | uVar14;
    }
  }
  return;
}

Assistant:

static void
qtree_bitins64(unsigned char a[], int nx, int ny, LONGLONG b[], int n, int bit)
/*
   int n;		declared y dimension of b
*/
{
int i, j, k;
int s00;
LONGLONG plane_val;

	plane_val = ((LONGLONG) 1) << bit;

	/*
	 * expand each 2x2 block
	 */
	k = 0;							/* k   is index of a[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of b[i,j]		*/

  /* Note:
     this code appears to run very slightly faster on a 32-bit linux
     machine using s00+n rather than the s10 intermediate variable
  */
  /*		s10 = s00+n;	*/			/* s10 is index of b[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			b[s00+n+1] |= plane_val;
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00+n+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s10+1] |= ((LONGLONG) ( a[k]     & 1)) << bit;
			b[s10  ] |= ((((LONGLONG)a[k])>>1) & 1) << bit;
			b[s00+1] |= ((((LONGLONG)a[k])>>2) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			s00 += 2;
/*			s10 += 2;  */
			k += 1;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			break;
		    case(7):
			b[s00+n  ] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }
/*
			b[s10  ] |= ((((LONGLONG)a[k])>>1) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10, s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s00+1] |= ((((LONGLONG)a[k])>>2) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			s00 += 2;
			k += 1;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			break;
		    case(7):
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00  ] |= plane_val;
			break;
		    }
/*
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			k += 1;
		}
	}
}